

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O1

void __thiscall
tst_SerialiserCommon::checkModelEqual
          (tst_SerialiserCommon *this,QAbstractItemModel *a,QAbstractItemModel *b,
          QModelIndex *aParent,QModelIndex *bParent,bool checkHeaders)

{
  ulong uVar1;
  char cVar2;
  compare_eq_result_container<QMap<int,_QVariant>,_int,_QVariant> cVar3;
  undefined1 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  QMap<int,_QVariant> bItemData;
  QMap<int,_QVariant> aItemData;
  bool hasChildren;
  undefined7 uStack_c7;
  const_iterator cStack_c0;
  long local_b8;
  ulong local_a8;
  QModelIndex *local_a0;
  QList<int> local_98;
  QModelIndex *local_80;
  QModelIndex bIdx;
  QModelIndex aIdx;
  
  bVar11 = false;
  if ((-1 < aParent->r) && (-1 < aParent->c)) {
    bVar11 = aParent->m != (QAbstractItemModel *)0x0;
  }
  local_a0 = bParent;
  local_80 = aParent;
  uVar5 = (**(code **)(*(long *)a + 0x78))(a,aParent);
  iVar6 = (**(code **)(*(long *)b + 0x78))(b,local_a0);
  cVar2 = QTest::qCompare(iVar6,uVar5,"b->rowCount(bParent)","rowC",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                          ,0x3a);
  if (cVar2 != '\0') {
    iVar6 = (**(code **)(*(long *)a + 0x80))(a,local_80);
    iVar7 = (**(code **)(*(long *)b + 0x80))(b,local_a0);
    cVar2 = QTest::qCompare(iVar7,iVar6,"b->columnCount(bParent)","colC",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                            ,0x3c);
    if (cVar2 != '\0') {
      if (!bVar11 && checkHeaders) {
        if (0 < (int)uVar5) {
          uVar8 = 0;
          do {
            (**(code **)(*(long *)a + 0xa0))(&aIdx,a,uVar8,2,0);
            (**(code **)(*(long *)b + 0xa0))(&bIdx,b,uVar8,2,0);
            bVar11 = (bool)QVariant::equals((QVariant *)&aIdx);
            pcVar9 = QTest::toString<QVariant>((QVariant *)&aIdx);
            pcVar10 = QTest::toString<QVariant>((QVariant *)&bIdx);
            cVar2 = QTest::compare_helper
                              (bVar11,"Compared values are not the same",pcVar9,pcVar10,
                               "a->headerData(i, Qt::Vertical)","b->headerData(i, Qt::Vertical)",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                               ,0x3f);
            QVariant::~QVariant((QVariant *)&bIdx);
            QVariant::~QVariant((QVariant *)&aIdx);
            if (cVar2 == '\0') {
              return;
            }
            (**(code **)(*(long *)a + 0xa0))(&aIdx,a,uVar8,2,0x100);
            (**(code **)(*(long *)b + 0xa0))(&bIdx,b,uVar8,2,0x100);
            bVar11 = (bool)QVariant::equals((QVariant *)&aIdx);
            pcVar9 = QTest::toString<QVariant>((QVariant *)&aIdx);
            pcVar10 = QTest::toString<QVariant>((QVariant *)&bIdx);
            cVar2 = QTest::compare_helper
                              (bVar11,"Compared values are not the same",pcVar9,pcVar10,
                               "a->headerData(i, Qt::Vertical, Qt::UserRole)",
                               "b->headerData(i, Qt::Vertical, Qt::UserRole)",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                               ,0x40);
            QVariant::~QVariant((QVariant *)&bIdx);
            QVariant::~QVariant((QVariant *)&aIdx);
            if (cVar2 == '\0') {
              return;
            }
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
        if (0 < iVar6) {
          iVar7 = 0;
          do {
            (**(code **)(*(long *)a + 0xa0))(&aIdx,a,iVar7,1,0);
            (**(code **)(*(long *)b + 0xa0))(&bIdx,b,iVar7,1,0);
            bVar11 = (bool)QVariant::equals((QVariant *)&aIdx);
            pcVar9 = QTest::toString<QVariant>((QVariant *)&aIdx);
            pcVar10 = QTest::toString<QVariant>((QVariant *)&bIdx);
            cVar2 = QTest::compare_helper
                              (bVar11,"Compared values are not the same",pcVar9,pcVar10,
                               "a->headerData(i, Qt::Horizontal)","b->headerData(i, Qt::Horizontal)"
                               ,
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                               ,0x43);
            QVariant::~QVariant((QVariant *)&bIdx);
            QVariant::~QVariant((QVariant *)&aIdx);
            if (cVar2 == '\0') {
              return;
            }
            (**(code **)(*(long *)a + 0xa0))(&aIdx,a,iVar7,1,0x100);
            (**(code **)(*(long *)b + 0xa0))(&bIdx,b,iVar7,1,0x100);
            bVar11 = (bool)QVariant::equals((QVariant *)&aIdx);
            pcVar9 = QTest::toString<QVariant>((QVariant *)&aIdx);
            pcVar10 = QTest::toString<QVariant>((QVariant *)&bIdx);
            cVar2 = QTest::compare_helper
                              (bVar11,"Compared values are not the same",pcVar9,pcVar10,
                               "a->headerData(i, Qt::Horizontal, Qt::UserRole)",
                               "b->headerData(i, Qt::Horizontal, Qt::UserRole)",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                               ,0x44);
            QVariant::~QVariant((QVariant *)&bIdx);
            QVariant::~QVariant((QVariant *)&aIdx);
            if (cVar2 == '\0') {
              return;
            }
            iVar7 = iVar7 + 1;
          } while (iVar6 != iVar7);
        }
      }
      if (0 < (int)uVar5) {
        local_a8 = 0;
        do {
          if (0 < iVar6) {
            iVar7 = 0;
            do {
              uVar1 = local_a8;
              (**(code **)(*(long *)a + 0x60))(&aIdx,a,local_a8 & 0xffffffff,iVar7,local_80);
              (**(code **)(*(long *)b + 0x60))(&bIdx,b,uVar1 & 0xffffffff,iVar7,local_a0);
              (**(code **)(*(long *)a + 0xb0))(&aItemData,a,&aIdx);
              (**(code **)(*(long *)b + 0xb0))(&bItemData,b,&bIdx);
              if (bItemData.d.d ==
                  (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                   *)0x0) {
                _hasChildren = (QArrayData *)0x0;
                cStack_c0.i = (int *)0x0;
                local_b8 = 0;
              }
              else {
                QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                ::keys((QList<int> *)&hasChildren,
                       (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                        *)bItemData.d.d);
              }
              if (aItemData.d.d ==
                  (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                   *)0x0) {
                local_98.d.d = (Data *)0x0;
                local_98.d.ptr = (int *)0x0;
                local_98.d.size = 0;
              }
              else {
                QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                ::keys(&local_98,
                       (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                        *)aItemData.d.d);
              }
              bVar11 = QTest::
                       _q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
                                 (cStack_c0,(const_iterator)(cStack_c0.i + local_b8),
                                  (const_iterator)local_98.d.ptr,
                                  (const_iterator)(local_98.d.ptr + local_98.d.size),
                                  "bItemData.keys()","aItemData.keys()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                                  ,0x4d);
              if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,8);
                }
              }
              if (_hasChildren != (QArrayData *)0x0) {
                LOCK();
                (_hasChildren->ref_)._q_value.super___atomic_base<int>._M_i =
                     (_hasChildren->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((_hasChildren->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(_hasChildren,4,8);
                }
              }
              if (!bVar11) {
LAB_0010a866:
                QtPrivate::
                QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                ::~QExplicitlySharedDataPointerV2(&bItemData.d);
                QtPrivate::
                QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                ::~QExplicitlySharedDataPointerV2(&aItemData.d);
                return;
              }
              cVar3 = operator==(&bItemData,&aItemData);
              cVar2 = QTest::compare_helper
                                (cVar3,"Compared values are not the same",(char *)0x0,(char *)0x0,
                                 "bItemData","aItemData",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                                 ,0x4e);
              if (cVar2 == '\0') goto LAB_0010a866;
              uVar4 = (**(code **)(*(long *)a + 0x88))(a,&aIdx);
              _hasChildren = (QArrayData *)CONCAT71(uStack_c7,uVar4);
              cVar2 = (**(code **)(*(long *)b + 0x88))(b,&bIdx);
              local_98.d.d = (Data *)CONCAT71(local_98.d.d._1_7_,cVar2);
              bVar11 = hasChildren;
              pcVar9 = QTest::toString<bool>((bool *)&local_98);
              pcVar10 = QTest::toString<bool>(&hasChildren);
              cVar2 = QTest::compare_helper
                                (bVar11 == (bool)cVar2,"Compared values are not the same",pcVar9,
                                 pcVar10,"b->hasChildren(bIdx)","hasChildren",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                                 ,0x50);
              if (cVar2 == '\0') goto LAB_0010a866;
              if (hasChildren == true) {
                checkModelEqual(this,a,b,&aIdx,&bIdx,checkHeaders);
              }
              QtPrivate::
              QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              ::~QExplicitlySharedDataPointerV2(&bItemData.d);
              QtPrivate::
              QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              ::~QExplicitlySharedDataPointerV2(&aItemData.d);
              if (cVar2 == '\0') {
                return;
              }
              iVar7 = iVar7 + 1;
            } while (iVar6 != iVar7);
          }
          uVar8 = (int)local_a8 + 1;
          local_a8 = (ulong)uVar8;
        } while (uVar8 != uVar5);
      }
    }
  }
  return;
}

Assistant:

void tst_SerialiserCommon::checkModelEqual(const QAbstractItemModel *a, const QAbstractItemModel *b, const QModelIndex &aParent,
                                           const QModelIndex &bParent, bool checkHeaders) const
{
    Q_ASSERT(a);
    Q_ASSERT(b);
    const bool aParentValid = aParent.isValid();
    Q_ASSERT(!aParentValid || aParent.model() == a);
    Q_ASSERT(!bParent.isValid() || bParent.model() == b);
    Q_ASSERT(aParentValid == bParent.isValid());
    const int rowC = a->rowCount(aParent);
    QCOMPARE(b->rowCount(bParent), rowC);
    const int colC = a->columnCount(aParent);
    QCOMPARE(b->columnCount(bParent), colC);
    if (!aParentValid && checkHeaders) {
        for (int i = 0; i < rowC; ++i) {
            QCOMPARE(a->headerData(i, Qt::Vertical), b->headerData(i, Qt::Vertical));
            QCOMPARE(a->headerData(i, Qt::Vertical, Qt::UserRole), b->headerData(i, Qt::Vertical, Qt::UserRole));
        }
        for (int i = 0; i < colC; ++i) {
            QCOMPARE(a->headerData(i, Qt::Horizontal), b->headerData(i, Qt::Horizontal));
            QCOMPARE(a->headerData(i, Qt::Horizontal, Qt::UserRole), b->headerData(i, Qt::Horizontal, Qt::UserRole));
        }
    }
    for (int i = 0; i < rowC; ++i) {
        for (int j = 0; j < colC; ++j) {
            const QModelIndex aIdx = a->index(i, j, aParent);
            const QModelIndex bIdx = b->index(i, j, bParent);
            const auto aItemData = a->itemData(aIdx);
            const auto bItemData = b->itemData(bIdx);
            QCOMPARE(bItemData.keys(), aItemData.keys());
            QCOMPARE(bItemData, aItemData);
            const bool hasChildren = a->hasChildren(aIdx);
            QCOMPARE(b->hasChildren(bIdx), hasChildren);
            if (hasChildren) {
                checkModelEqual(a, b, aIdx, bIdx, checkHeaders);
            }
        }
    }
}